

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O3

void __thiscall
FlatIndexBuilder::add_file(FlatIndexBuilder *this,FileId fid,uint8_t *data,size_t size)

{
  IndexType type;
  TrigramGenerator p_Var1;
  FileId FVar2;
  FileId local_44;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  type = (this->super_IndexBuilder).ntype;
  FVar2 = fid;
  if (fid < this->max_fileid_) {
    FVar2 = this->max_fileid_;
  }
  this->max_fileid_ = FVar2;
  local_44 = fid;
  p_Var1 = get_generator_for(type);
  local_28 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/FlatIndexBuilder.cpp:134:27)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/FlatIndexBuilder.cpp:134:27)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  local_40._8_8_ = &local_44;
  (*p_Var1)(data,size,(TrigramCallback *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void FlatIndexBuilder::add_file(FileId fid, const uint8_t *data, size_t size) {
    max_fileid_ = std::max(fid, max_fileid_);
    TrigramGenerator generator = get_generator_for(index_type());
    generator(data, size, [&](TriGram val) { add_trigram(fid, val); });
}